

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O3

OclPlatform __thiscall xmrig::OclConfig::platform(OclConfig *this)

{
  bool bVar1;
  ulong uVar2;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  size_t sVar3;
  undefined8 *puVar4;
  char *pcVar5;
  cl_platform_id p_Var6;
  OclPlatform OVar7;
  String vendor;
  String search;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> platforms;
  String local_78;
  String local_68;
  undefined8 *local_50;
  undefined8 *local_48;
  OclPlatform local_38;
  
  OclPlatform::get();
  if (local_50 == local_48) {
    sVar3 = 0;
    p_Var6 = (cl_platform_id)0x0;
    goto LAB_0016111d;
  }
  if ((this->m_platformVendor).m_size == 0) {
    uVar2 = (ulong)this->m_platformIndex;
    sVar3 = 0;
    p_Var6 = (cl_platform_id)0x0;
    if (uVar2 < (ulong)((long)local_48 - (long)local_50 >> 4)) {
      p_Var6 = (cl_platform_id)local_50[uVar2 * 2];
      sVar3 = local_50[uVar2 * 2 + 1];
    }
    goto LAB_0016111d;
  }
  local_68.m_data = (char *)0x0;
  local_68.m_size = 0;
  String::String(&local_78,&this->m_platformVendor);
  String::toUpper(&local_78);
  bVar1 = String::isEqual(&local_78,"AMD");
  if (bVar1) {
    pcVar5 = "Advanced Micro Devices";
    src_00 = extraout_RDX;
LAB_0016109a:
    String::copy(&local_68,(EVP_PKEY_CTX *)pcVar5,src_00);
  }
  else {
    pcVar5 = "NVIDIA";
    bVar1 = String::isEqual(&local_78,"NVIDIA");
    src_00 = extraout_RDX_00;
    if (bVar1) goto LAB_0016109a;
    bVar1 = String::isEqual(&local_78,"INTEL");
    if (bVar1) {
      pcVar5 = "Intel";
      src_00 = src;
      goto LAB_0016109a;
    }
    String::copy(&local_68,(EVP_PKEY_CTX *)&this->m_platformVendor,src);
  }
  if (local_50 != local_48) {
    puVar4 = local_50;
    do {
      OclPlatform::vendor(&local_38);
      p_Var6 = local_38.m_id;
      if (local_38.m_id != (cl_platform_id)0x0) {
        pcVar5 = strstr((char *)local_38.m_id,local_68.m_data);
        operator_delete__(p_Var6);
        if (pcVar5 != (char *)0x0) {
          p_Var6 = (cl_platform_id)*puVar4;
          sVar3 = puVar4[1];
          if (local_78.m_data != (char *)0x0) {
            operator_delete__(local_78.m_data);
          }
          if (local_68.m_data != (char *)0x0) {
            operator_delete__(local_68.m_data);
          }
          goto LAB_0016111d;
        }
      }
      puVar4 = puVar4 + 2;
    } while (puVar4 != local_48);
  }
  if (local_78.m_data != (char *)0x0) {
    operator_delete__(local_78.m_data);
  }
  if (local_68.m_data != (char *)0x0) {
    operator_delete__(local_68.m_data);
  }
  sVar3 = 0;
  p_Var6 = (cl_platform_id)0x0;
LAB_0016111d:
  if (local_50 != (undefined8 *)0x0) {
    operator_delete(local_50);
  }
  OVar7.m_index = sVar3;
  OVar7.m_id = p_Var6;
  return OVar7;
}

Assistant:

xmrig::OclPlatform xmrig::OclConfig::platform() const
{
    const auto platforms = OclPlatform::get();
    if (platforms.empty()) {
        return {};
    }

    if (!m_platformVendor.isEmpty()) {
        String search;
        String vendor = m_platformVendor;
        vendor.toUpper();

        if (vendor == kAMD) {
            search = "Advanced Micro Devices";
        }
        else if (vendor == kNVIDIA) {
            search = kNVIDIA;
        }
        else if (vendor == kINTEL) {
            search = "Intel";
        }
        else {
            search = m_platformVendor;
        }

        for (const auto &platform : platforms) {
            if (platform.vendor().contains(search)) {
                return platform;
            }
        }
    }
    else if (m_platformIndex < platforms.size()) {
        return platforms[m_platformIndex];
    }

    return {};
}